

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O2

void __thiscall MCU::quantify(MCU *this)

{
  byte bVar1;
  byte bVar2;
  long lVar3;
  int w;
  ulong uVar4;
  BLOCK (*paaaadVar5) [2] [2];
  BLOCK (*paaaadVar6) [2] [2];
  int h;
  ulong uVar7;
  BLOCK (*paaaadVar8) [2] [2];
  long lVar9;
  int j;
  long lVar10;
  int *piVar11;
  BLOCK (*paaaadVar12) [2] [2];
  
  paaaadVar5 = this->mcu;
  for (lVar3 = 1; paaaadVar5 = paaaadVar5 + 1, lVar3 != 4; lVar3 = lVar3 + 1) {
    bVar1 = subVector[lVar3].height;
    paaaadVar6 = paaaadVar5;
    for (uVar7 = 0; uVar7 != bVar1; uVar7 = uVar7 + 1) {
      bVar2 = subVector[lVar3].width;
      paaaadVar8 = paaaadVar6;
      for (uVar4 = 0; uVar4 != bVar2; uVar4 = uVar4 + 1) {
        piVar11 = quantTable[subVector[lVar3].quant];
        paaaadVar12 = paaaadVar8;
        for (lVar9 = 0; lVar9 != 8; lVar9 = lVar9 + 1) {
          for (lVar10 = 0; lVar10 != 8; lVar10 = lVar10 + 1) {
            (*paaaadVar12)[0][0][0][lVar10] =
                 (double)piVar11[lVar10] * (*paaaadVar12)[0][0][0][lVar10];
          }
          piVar11 = piVar11 + 8;
          paaaadVar12 = (BLOCK (*) [2] [2])((*paaaadVar12)[0][0] + 1);
        }
        paaaadVar8 = (BLOCK (*) [2] [2])((*paaaadVar8)[0] + 1);
      }
      paaaadVar6 = (BLOCK (*) [2] [2])(*paaaadVar6 + 1);
    }
  }
  return;
}

Assistant:

void quantify() {
        for (int id = 1; id <= 3; id++) {
            for (int h = 0; h < subVector[id].height; h++) {
                for (int w = 0; w < subVector[id].width; w++) {
                    for (int i = 0; i < 8; i++) {
                        for (int j = 0; j < 8; j++) {
                            mcu[id][h][w][i][j] *= quantTable[subVector[id].quant][i*8 + j];
                        }
                    }
                }
            }
        }
    }